

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer_interface.h
# Opt level: O0

void __thiscall
yyml::nn::OptimizerInterface::Apply(OptimizerInterface *this,function<double_()> *init_func)

{
  Variable<double> *pVVar1;
  bool bVar2;
  reference ppVVar3;
  size_t sVar4;
  double dVar5;
  ulong local_40;
  size_t i;
  Variable<double> *parameter;
  iterator __end2;
  iterator __begin2;
  vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_> *__range2;
  function<double_()> *init_func_local;
  OptimizerInterface *this_local;
  
  __end2 = std::vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
           ::begin(&this->parameters_);
  parameter = (Variable<double> *)
              std::
              vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>::
              end(&this->parameters_);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<yyml::nn::Variable<double>_**,_std::vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>_>
                                *)&parameter);
    if (!bVar2) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<yyml::nn::Variable<double>_**,_std::vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>_>
              ::operator*(&__end2);
    pVVar1 = *ppVVar3;
    local_40 = 0;
    while( true ) {
      sVar4 = Tensor<double>::total(&pVVar1->grads_);
      if (sVar4 <= local_40) break;
      dVar5 = std::function<double_()>::operator()(init_func);
      (pVVar1->values_).data_[local_40] = dVar5;
      local_40 = local_40 + 1;
    }
    __gnu_cxx::
    __normal_iterator<yyml::nn::Variable<double>_**,_std::vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void Apply(std::function<double()> init_func) {
    for (auto* parameter : parameters_) {
      for (size_t i = 0; i < parameter->grads_.total(); i++) {
        parameter->values_.data_[i] = init_func();
      }
    }
  }